

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

double __thiscall crnlib::symbol_histogram::calc_entropy(symbol_histogram *this)

{
  uint uVar1;
  uint *puVar2;
  double dVar3;
  double dVar4;
  double bits;
  uint i_1;
  double inv_total;
  double neg_inv_log2;
  double entropy;
  double dStack_20;
  uint i;
  double total;
  symbol_histogram *this_local;
  
  dStack_20 = 0.0;
  entropy._4_4_ = 0;
  while( true ) {
    uVar1 = vector<unsigned_int>::size(&this->m_hist);
    if (uVar1 <= entropy._4_4_) break;
    puVar2 = vector<unsigned_int>::operator[](&this->m_hist,entropy._4_4_);
    dStack_20 = (double)*puVar2 + dStack_20;
    entropy._4_4_ = entropy._4_4_ + 1;
  }
  if ((dStack_20 != 0.0) || (NAN(dStack_20))) {
    neg_inv_log2 = 0.0;
    dVar3 = std::log(5.30498947741318e-315);
    bits._4_4_ = 0;
    while( true ) {
      uVar1 = vector<unsigned_int>::size(&this->m_hist);
      if (uVar1 <= bits._4_4_) break;
      puVar2 = vector<unsigned_int>::operator[](&this->m_hist,bits._4_4_);
      if (*puVar2 != 0) {
        puVar2 = vector<unsigned_int>::operator[](&this->m_hist,bits._4_4_);
        dVar4 = log((double)*puVar2 * (1.0 / dStack_20));
        puVar2 = vector<unsigned_int>::operator[](&this->m_hist,bits._4_4_);
        neg_inv_log2 = dVar4 * (double)(-1.0 / SUB84(dVar3,0)) * (double)*puVar2 + neg_inv_log2;
      }
      bits._4_4_ = bits._4_4_ + 1;
    }
    this_local = (symbol_histogram *)neg_inv_log2;
  }
  else {
    this_local = (symbol_histogram *)0x0;
  }
  return (double)this_local;
}

Assistant:

double symbol_histogram::calc_entropy() const
    {
        double total = 0.0f;
        for (uint i = 0; i < m_hist.size(); i++)
        {
            total += m_hist[i];
        }
        if (total == 0.0f)
        {
            return 0.0f;
        }

        double entropy = 0.0f;
        double neg_inv_log2 = -1.0f / log(2.0f);
        double inv_total = 1.0f / total;
        for (uint i = 0; i < m_hist.size(); i++)
        {
            if (m_hist[i])
            {
                double bits = log(m_hist[i] * inv_total) * neg_inv_log2;
                entropy += bits * m_hist[i];
            }
        }

        return entropy;
    }